

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O2

void queries::API::TriplePatern
               (vector<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_> *constrains,
               vector<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_> *projections,
               vector<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>
               *resultsmaster,
               vector<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>
               *provmaster)

{
  size_t *psVar1;
  pointer pTVar2;
  KEY_ID id;
  TYPE_ID TVar3;
  TYPE_ID s;
  _Rb_tree<std::pair<unsigned_long_const,Molecule>*,std::pair<unsigned_long_const,Molecule>*,std::_Identity<std::pair<unsigned_long_const,Molecule>*>,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>
  *this;
  iterator iVar4;
  _Rb_tree_node_base *p_Var5;
  pointer puVar6;
  ulong uVar7;
  _Self __tmp;
  long lVar8;
  long lVar9;
  undefined1 local_100 [8];
  set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
  molecules;
  pair<const_unsigned_long,_Molecule> *m;
  __node_base_ptr p_Stack_a0;
  ulong local_98;
  _Rb_tree_node_base *local_90;
  vector<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>
  *local_88;
  vector<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>
  *local_80;
  undefined1 auStack_78 [8];
  vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  results;
  undefined1 auStack_58 [8];
  vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  prov;
  
  molecules._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&molecules;
  molecules._M_t._M_impl._0_4_ = 0;
  molecules._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  molecules._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  molecules._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  pTVar2 = (constrains->super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>).
           _M_impl.super__Vector_impl_data._M_start;
  molecules._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       molecules._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_88 = resultsmaster;
  local_80 = provmaster;
  if ((constrains->super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>)._M_impl.
      super__Vector_impl_data._M_finish == pTVar2) {
    molecules._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)Molecules::GetPair((Molecules *)diplo::M,
                                    ((projections->
                                     super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->subject);
    if ((pair<const_unsigned_long,_Molecule> *)
        molecules._M_t._M_impl.super__Rb_tree_header._M_node_count ==
        (pair<const_unsigned_long,_Molecule> *)0x0) {
LAB_00127505:
      this = (_Rb_tree<std::pair<unsigned_long_const,Molecule>*,std::pair<unsigned_long_const,Molecule>*,std::_Identity<std::pair<unsigned_long_const,Molecule>*>,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>
              *)0x0;
    }
    else {
      this = (_Rb_tree<std::pair<unsigned_long_const,Molecule>*,std::pair<unsigned_long_const,Molecule>*,std::_Identity<std::pair<unsigned_long_const,Molecule>*>,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>
              *)local_100;
      std::
      _Rb_tree<std::pair<unsigned_long_const,Molecule>*,std::pair<unsigned_long_const,Molecule>*,std::_Identity<std::pair<unsigned_long_const,Molecule>*>,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>
      ::_M_insert_unique<std::pair<unsigned_long_const,Molecule>*const&>
                (this,(pair<const_unsigned_long,_Molecule> **)
                      &molecules._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
  }
  else if (pTVar2->subject == 0) {
    if (pTVar2->object == 0xffffffffffffffff) goto LAB_00127823;
    this = (_Rb_tree<std::pair<unsigned_long_const,Molecule>*,std::pair<unsigned_long_const,Molecule>*,std::_Identity<std::pair<unsigned_long_const,Molecule>*>,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>
            *)Molecules::GetMoleculesFromInvertedIdx((Molecules *)diplo::M,pTVar2->object);
  }
  else {
    molecules._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)Molecules::GetPair((Molecules *)diplo::M,pTVar2->subject);
    if ((pair<const_unsigned_long,_Molecule> *)
        molecules._M_t._M_impl.super__Rb_tree_header._M_node_count ==
        (pair<const_unsigned_long,_Molecule> *)0x0) goto LAB_00127505;
    this = (_Rb_tree<std::pair<unsigned_long_const,Molecule>*,std::pair<unsigned_long_const,Molecule>*,std::_Identity<std::pair<unsigned_long_const,Molecule>*>,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>
            *)local_100;
    std::
    _Rb_tree<std::pair<unsigned_long_const,Molecule>*,std::pair<unsigned_long_const,Molecule>*,std::_Identity<std::pair<unsigned_long_const,Molecule>*>,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>
    ::_M_insert_unique<std::pair<unsigned_long_const,Molecule>*const&>
              (this,(pair<const_unsigned_long,_Molecule> **)
                    &molecules._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  if (this != (_Rb_tree<std::pair<unsigned_long_const,Molecule>*,std::pair<unsigned_long_const,Molecule>*,std::_Identity<std::pair<unsigned_long_const,Molecule>*>,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>
               *)0x0) {
    local_90 = (_Rb_tree_node_base *)(this + 8);
    for (p_Var5 = *(_Rb_tree_node_base **)(this + 0x18); p_Var5 != local_90;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      if ((diplo::ProvTrigerON == '\x01') && (diplo::ProvMolecules._24_8_ != 0)) {
        iVar4 = std::
                _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)diplo::ProvMolecules,*(key_type **)(p_Var5 + 1));
        if (iVar4.super__Node_iterator_base<unsigned_long,_false>._M_cur != (__node_type *)0x0)
        goto LAB_0012758a;
      }
      else {
LAB_0012758a:
        diplo::ProvFilterCH = 0;
        diplo::moleculesCounter = diplo::moleculesCounter + 1;
        molecules._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&p_Stack_a0;
        p_Stack_a0 = (__node_base_ptr)0x0;
        auStack_78 = (undefined1  [8])0x0;
        results.
        super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        results.
        super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        auStack_58 = (undefined1  [8])0x0;
        prov.
        super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        prov.
        super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        std::
        vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
        ::resize((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                  *)auStack_78,
                 ((long)(projections->
                        super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(projections->
                        super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 5) + 1);
        std::
        vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
        ::resize((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                  *)auStack_58,
                 ((long)(projections->
                        super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(projections->
                        super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 5) +
                 ((long)(constrains->
                        super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(constrains->
                        super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 5));
        puVar6 = (pointer)0x0;
        lVar8 = 0;
        uVar7 = 0;
        while (uVar7 < (ulong)((long)(constrains->
                                     super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(constrains->
                                     super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 5)) {
          psVar1 = &molecules._M_t._M_impl.super__Rb_tree_header._M_node_count;
          local_98 = uVar7;
          prov.
          super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar6;
          std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::clear((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)psVar1);
          id = *(KEY_ID *)
                ((long)&((constrains->
                         super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>).
                         _M_impl.super__Vector_impl_data._M_start)->object + lVar8);
          TVar3 = 0xffffffff;
          if (id != 0xffffffffffffffff) {
            TVar3 = KeyManager::GetType(id);
          }
          s = KeyManager::GetType(**(KEY_ID **)(p_Var5 + 1));
          TemplateManager::GetTemplates
                    ((TemplateManager *)diplo::TM,s,
                     *(KEY_ID *)
                      ((long)&((constrains->
                               super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>
                               )._M_impl.super__Vector_impl_data._M_start)->predicate + lVar8),TVar3
                     ,0,(unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)psVar1);
          Molecule::CheckIfEntityExists
                    ((Molecule *)(*(long *)(p_Var5 + 1) + 8),
                     (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)psVar1,
                     *(KEY_ID *)
                      ((long)&((constrains->
                               super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>
                               )._M_impl.super__Vector_impl_data._M_start)->object + lVar8),0,
                     (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)((long)&((_Hashtable *)auStack_58)->_M_buckets +
                        (long)&((prov.
                                 super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_h).
                               _M_buckets));
          if ((*(long *)((long)&((_Hashtable *)auStack_58)->_M_element_count +
                        (long)prov.
                              super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage) == 0) &&
             (*(long *)((long)&((constrains->
                                super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>
                                )._M_impl.super__Vector_impl_data._M_start)->prov + lVar8) == 0))
          goto LAB_001277d7;
          lVar8 = lVar8 + 0x20;
          puVar6 = prov.
                   super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
          uVar7 = local_98 + 1;
        }
        lVar8 = 0;
        lVar9 = 0;
        puVar6 = (pointer)0x0;
        while (puVar6 < (pointer)((long)(projections->
                                        super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(projections->
                                        super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>
                                        )._M_impl.super__Vector_impl_data._M_start >> 5)) {
          prov.
          super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar6;
          std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::clear((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&molecules._M_t._M_impl.super__Rb_tree_header._M_node_count);
          psVar1 = &molecules._M_t._M_impl.super__Rb_tree_header._M_node_count;
          TVar3 = KeyManager::GetType(**(KEY_ID **)(p_Var5 + 1));
          TemplateManager::GetTemplates
                    ((TemplateManager *)diplo::TM,TVar3,
                     *(KEY_ID *)
                      ((long)&((projections->
                               super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>
                               )._M_impl.super__Vector_impl_data._M_start)->predicate + lVar9),
                     0xffffffff,0,
                     (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)psVar1);
          Molecule::GetEntity((Molecule *)(*(long *)(p_Var5 + 1) + 8),
                              (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                               *)psVar1,0,0,
                              (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                               *)((long)&((_Hashtable *)auStack_78)->_M_buckets + lVar8),
                              (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                               *)((long)&(((pointer)
                                          ((long)auStack_58 +
                                          ((long)(constrains->
                                                 super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>
                                                 )._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(constrains->
                                                 super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>
                                                 )._M_impl.super__Vector_impl_data._M_start >> 5) *
                                          0x38))->_M_h)._M_buckets + lVar8));
          if ((*(long *)((long)&((_Hashtable *)auStack_78)->_M_element_count + lVar8) == 0) &&
             (*(long *)((long)&((projections->
                                super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>
                                )._M_impl.super__Vector_impl_data._M_start)->prov + lVar9) == 0))
          goto LAB_001277d7;
          lVar9 = lVar9 + 0x20;
          lVar8 = lVar8 + 0x38;
          puVar6 = (pointer)((long)&((prov.
                                      super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_h).
                                    _M_buckets + 1);
        }
        std::
        vector<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>
        ::push_back(local_88,(value_type *)auStack_78);
        std::
        vector<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>
        ::push_back(local_80,(value_type *)auStack_58);
LAB_001277d7:
        if (diplo::ProvFilterCH != 0) {
          diplo::ProvFilterCounter = diplo::ProvFilterCounter + 1;
          diplo::ProvFilterCH = 0;
        }
        std::
        vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
        ::~vector((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                   *)auStack_58);
        std::
        vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
        ::~vector((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                   *)auStack_78);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)&molecules._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
    }
  }
LAB_00127823:
  std::
  _Rb_tree<std::pair<const_unsigned_long,_Molecule>_*,_std::pair<const_unsigned_long,_Molecule>_*,_std::_Identity<std::pair<const_unsigned_long,_Molecule>_*>,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
  ::~_Rb_tree((_Rb_tree<std::pair<const_unsigned_long,_Molecule>_*,_std::pair<const_unsigned_long,_Molecule>_*,_std::_Identity<std::pair<const_unsigned_long,_Molecule>_*>,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
               *)local_100);
  return;
}

Assistant:

void API::TriplePatern(vector<TripleIDs>& constrains, vector<TripleIDs>& projections, vector<vector<unordered_set<KEY_ID>>> & resultsmaster, vector<vector<unordered_set<KEY_ID>>> & provmaster) {
    set<pair<const KEY_ID, Molecule>*> molecules;
    set<pair<const KEY_ID, Molecule>*>* Molecules_with_O = NULL;
//	cerr << "constrains[0].subject: " << constrains[0].subject << endl;
    if (constrains.size() > 0) {
        if (constrains[0].subject != 0) {
            pair<const KEY_ID, Molecule>* m = diplo::M.GetPair(constrains[0].subject);
            if (m) {
                molecules.insert(m);
                Molecules_with_O = &molecules;
//									cerr << "ok\t" << m->first << endl;
            }
        } else if (constrains[0].object != -1) {
            Molecules_with_O = diplo::M.GetMoleculesFromInvertedIdx(constrains[0].object);
        }
    } else {
        pair<const KEY_ID, Molecule>* m = diplo::M.GetPair(projections[0].subject);
        if (m) {
            molecules.insert(m);
            Molecules_with_O = &molecules;
//					cerr << "ok\t" << m->first << endl;
        }
    }

//
//	set<pair<const KEY_ID, Molecule>*>* Molecules_with_O = diplo::M.GetMoleculesFromInvertedIdx(constrains[0].object);


    if (Molecules_with_O) { // do we have any of this

        for (set<pair<const KEY_ID, Molecule>*>::iterator it = Molecules_with_O->begin(); it != Molecules_with_O->end(); it++) {

//             if (ProvTrigerON) {
//                 bool getit = false;
//                 for (auto p : ProvUris ) {
//                     auto ms = ProvIdx.find(p);
//                     if (ms == ProvIdx.end()) continue;
// 
//                     if (ms->second.find((*it)->first) != ms->second.end()) {
//                         getit = true;
//                         break;
//                     }
//                 }
//                 if (!getit) continue;
//             }
		  
            if (ProvTrigerON and !ProvMolecules.empty())
                if (ProvMolecules.find((*it)->first) == ProvMolecules.end())
                    continue;
		  
		  
		  
            //cerr << "molecules: " << diplo::KM.Get((*it)->first) << endl;
            diplo::ProvFilterCH = false;
            diplo::moleculesCounter++;
            unordered_set<size_t> tripleTemplates;
            vector<unordered_set<KEY_ID>> results;
            vector<unordered_set<KEY_ID> > prov;

            results.resize(projections.size()+1);
            prov.resize( constrains.size()+projections.size() );
            bool cont = false;
            for (size_t i = 0; i < constrains.size(); i++) {
                tripleTemplates.clear();
                TYPE_ID tt;
                if (constrains[i].object == -1) tt = -1;
                else tt = diplo::KM.GetType(constrains[i].object);

                diplo::TM.GetTemplates(diplo::KM.GetType((*it)->first), constrains[i].predicate, tt, 0, &tripleTemplates);

                (*it)->second.CheckIfEntityExists(&tripleTemplates, constrains[i].object, 0, &prov[i]); // FIXME get prov
                if (prov[i].size() <= 0 and constrains[i].prov == 0) {
//					cerr << "OK2 " << tripleTemplates.size() << endl;
                    cont = true;
                    break;
                }
            }
            if (cont)
                goto end;

            for (size_t i = 0; i < projections.size(); i++) {
                tripleTemplates.clear();
                diplo::TM.GetTemplates(diplo::KM.GetType((*it)->first), projections[i].predicate, -1, 0, &tripleTemplates);
                (*it)->second.GetEntity(&tripleTemplates, 0, 0, &results[i], &prov[i + constrains.size()]);  // FIXME get prov
//				cerr << "OK2 " << (*it)->first << "\t" << projections[i].predicate << "\t" << tripleTemplates.size() << endl;
                if (results[i].size() <= 0 and projections[i].prov == 0) {
                    cont = true;
                    break;
                }
            }
             if (cont)
                 goto end;



//			copy(results.begin(), results.end(), back_inserter(resultsmaster));
//			copy(prov.begin(), prov.end(), back_inserter(provmaster));
            resultsmaster.push_back(results);
            provmaster.push_back(prov);

            //	cout << "a-->\t" << (*it)->first << "\t" << diplo::KM.Get((*it)->first) << endl;

//			if ((*it)->first == 2097152001)
//				(*it)->second.Display();
end:
            if (diplo::ProvFilterCH) {
                diplo::ProvFilterCounter++;
                diplo::ProvFilterCH = false;
            }
        }
    }

}